

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::anon_unknown_0::ToLowerCamel
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *words)

{
  char cVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  string local_40 [8];
  string word;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *words_local;
  string *result;
  
  word.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (word.field_2._8_4_ = 0; uVar2 = (ulong)(int)word.field_2._8_4_,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(words), uVar2 < sVar3; word.field_2._8_4_ = word.field_2._8_4_ + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](words,(long)(int)word.field_2._8_4_);
    std::__cxx11::string::string(local_40,(string *)pvVar4);
    if (((word.field_2._8_4_ == 0) &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40), '@' < *pcVar5)) &&
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar5 < '[')) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      *pcVar5 = cVar1 + ' ';
    }
    else if (((word.field_2._8_4_ != 0) &&
             (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40), '`' < *pcVar5)) &&
            (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar5 < '{')) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      cVar1 = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      *pcVar5 = cVar1 + -0x20;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToLowerCamel(const std::vector<string>& words) {
  string result;
  for (int i = 0; i < words.size(); i++) {
    string word = words[i];
    if (i == 0 && (word[0] >= 'A' && word[0] <= 'Z')) {
      word[0] = (word[0] - 'A') + 'a';
    } else if (i != 0 && (word[0] >= 'a' && word[0] <= 'z')) {
      word[0] = (word[0] - 'a') + 'A';
    }
    result += word;
  }
  return result;
}